

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseEngine.cpp
# Opt level: O0

void __thiscall
database::DatabaseEngine::ExecuteForDataDefinition
          (DatabaseEngine *this,Query *query,function<void_(bool)> *completion)

{
  TransactionMetaType TVar1;
  TransactionType TVar2;
  runtime_error *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>_>_>
  local_c0;
  string local_90;
  string local_70;
  string local_50;
  function<void_(bool)> *local_20;
  function<void_(bool)> *completion_local;
  Query *query_local;
  DatabaseEngine *this_local;
  
  local_20 = completion;
  completion_local = (function<void_(bool)> *)query;
  query_local = (Query *)this;
  TVar1 = Query::transactionMetaType(query);
  if (TVar1 == ddl) {
    TVar2 = Query::transactionType((Query *)completion_local);
    switch(TVar2) {
    case create_database:
      Query::databaseName_abi_cxx11_(&local_50,(Query *)completion_local);
      CreateDatabase(this,&local_50,local_20);
      std::__cxx11::string::~string((string *)&local_50);
      break;
    case create_container:
      Query::databaseName_abi_cxx11_(&local_70,(Query *)completion_local);
      Query::containerName_abi_cxx11_(&local_90,(Query *)completion_local);
      Query::schema_abi_cxx11_(&local_c0,(Query *)completion_local);
      CreateContainer(this,&local_70,&local_90,&local_c0,local_20);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::QueryDataType>_>_>
      ::~map(&local_c0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      break;
    default:
      break;
    case drop_container:
      break;
    case drop_database:
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Inappropriate query attempted. DDL queries expected");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void database::DatabaseEngine::ExecuteForDataDefinition(const database::Query& query,const std::function<void(bool)>& completion)
{
  if(query.transactionMetaType() != database::ddl)
    throw std::runtime_error("Inappropriate query attempted. DDL queries expected");
  switch (query.transactionType())
  {
    case database::create_database:
      CreateDatabase(query.databaseName(),completion);
      break;
    case database::create_container:
      CreateContainer(query.databaseName(),query.containerName(),query.schema(),completion);
      break;
    // case database::alter:
    //   #pragma mark TODO
    //   break;
    case database::drop_container:
      #pragma mark TODO
      break;
    case database::drop_database:
      #pragma mark TODO
      break;
    default:
      break;
  }
}